

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_utils.c
# Opt level: O2

void vrna_seq_toRNA(char *sequence)

{
  uint uVar1;
  char cVar2;
  
  if (sequence == (char *)0x0) {
    return;
  }
  uVar1 = 0;
  do {
    cVar2 = sequence[uVar1];
    if (cVar2 == 'T') {
      cVar2 = 'U';
LAB_0012305f:
      sequence[uVar1] = cVar2;
    }
    else {
      if (cVar2 == 't') {
        cVar2 = 'u';
        goto LAB_0012305f;
      }
      if (cVar2 == '\0') {
        return;
      }
    }
    uVar1 = uVar1 + 1;
  } while( true );
}

Assistant:

PUBLIC void
vrna_seq_toRNA(char *sequence)
{
  unsigned int i;

  if (sequence) {
    for (i = 0; sequence[i]; i++) {
      if (sequence[i] == 'T')
        sequence[i] = 'U';

      if (sequence[i] == 't')
        sequence[i] = 'u';
    }
  }
}